

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_GetSampleSize(PaSampleFormat format)

{
  PaError PVar1;
  ulong uVar2;
  
  uVar2 = format & 0xffffffff7fffffff;
  if (uVar2 - 1 < 2) {
    PVar1 = 4;
  }
  else {
    if (uVar2 != 4) {
      PVar1 = 1;
      if ((uVar2 != 0x20) && (uVar2 != 0x10)) {
        if (uVar2 == 8) {
          return 2;
        }
        PVar1 = -0x270a;
      }
      return PVar1;
    }
    PVar1 = 3;
  }
  return PVar1;
}

Assistant:

PaError Pa_GetSampleSize( PaSampleFormat format )
{
    int result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetSampleSize" );
    PA_LOGAPI(("\tPaSampleFormat format: %d\n", format ));

    switch( format & ~paNonInterleaved )
    {

    case paUInt8:
    case paInt8:
        result = 1;
        break;

    case paInt16:
        result = 2;
        break;

    case paInt24:
        result = 3;
        break;

    case paFloat32:
    case paInt32:
        result = 4;
        break;

    default:
        result = paSampleFormatNotSupported;
        break;
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_GetSampleSize", "int: %d", result );

    return (PaError) result;
}